

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

void __thiscall Moc::prependNamespaces(Moc *this,BaseDef *def,QList<NamespaceDef> *namespaceList)

{
  long lVar1;
  NamespaceDef *pNVar2;
  long lVar3;
  long in_FS_OFFSET;
  QStringBuilder<const_QByteArray_&,_const_char_(&)[3]> local_60;
  QByteArray local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (namespaceList->d).size;
  if (lVar1 != 0) {
    lVar3 = lVar1 * -0x90;
    pNVar2 = (namespaceList->d).ptr + lVar1;
    do {
      lVar1 = (this->super_Parser).index;
      if ((pNVar2[-1].super_BaseDef.begin < lVar1) && (lVar1 < pNVar2[-1].super_BaseDef.end + -1)) {
        local_60.b = (char (*) [3])0x178804;
        local_60.a = (QByteArray *)(pNVar2 + -1);
        QStringBuilder<const_QByteArray_&,_const_char_(&)[3]>::convertTo<QByteArray>
                  (&local_50,&local_60);
        QByteArray::prepend(&def->qualified,&local_50);
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      lVar3 = lVar3 + 0x90;
      pNVar2 = pNVar2 + -1;
    } while (lVar3 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Moc::prependNamespaces(BaseDef &def, const QList<NamespaceDef> &namespaceList) const
{
    auto it = namespaceList.crbegin();
    const auto rend = namespaceList.crend();
    for (; it != rend; ++it) {
        if (inNamespace(&*it))
            def.qualified.prepend(it->classname + "::");
    }
}